

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void anon_unknown.dwarf_433838::convert_timeseries_option
               (Options *opts,char *ts_opt_name,string *target)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  string local_78;
  allocator<char> local_41;
  string local_40 [8];
  string spot_opt_name;
  string *target_local;
  char *ts_opt_name_local;
  Options *opts_local;
  
  spot_opt_name.field_2._8_8_ = target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"timeseries.",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::append((char *)local_40);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cali::ConfigManager::Options::is_set(opts,pcVar3);
  if (bVar2) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::append((char *)spot_opt_name.field_2._8_8_);
    }
    std::__cxx11::string::append((char *)spot_opt_name.field_2._8_8_);
    std::__cxx11::string::append((char *)spot_opt_name.field_2._8_8_);
    uVar1 = spot_opt_name.field_2._8_8_;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cali::ConfigManager::Options::get_abi_cxx11_(&local_78,opts,pcVar3,"");
    std::__cxx11::string::append((string *)uVar1);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void convert_timeseries_option(const ConfigManager::Options& opts, const char* ts_opt_name, std::string& target)
{
    std::string spot_opt_name = "timeseries.";
    spot_opt_name.append(ts_opt_name);

    if (opts.is_set(spot_opt_name.c_str())) {
        if (!target.empty())
            target.append(",");

        target.append(ts_opt_name);
        target.append("=");
        target.append(opts.get(spot_opt_name.c_str()));
    }
}